

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

Comparison __thiscall
Kernel::LiteralComparators::LexComparator::compare(LexComparator *this,Literal *l1,Literal *l2)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  undefined7 extraout_var;
  Term *pTVar4;
  uint f2;
  uint f1;
  TermList st2;
  TermList st1;
  SubtermIterator sit2;
  SubtermIterator sit1;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Term *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  TermList local_90;
  TermList local_88 [2];
  undefined8 local_78;
  Comparison local_4;
  
  uVar2 = Literal::header((Literal *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  uVar3 = Literal::header((Literal *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (uVar2 == uVar3) {
    SubtermIterator::SubtermIterator
              ((SubtermIterator *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               in_stack_ffffffffffffff38);
    SubtermIterator::SubtermIterator
              ((SubtermIterator *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               in_stack_ffffffffffffff38);
    do {
      while( true ) {
        bVar1 = SubtermIterator::hasNext
                          ((SubtermIterator *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (!bVar1) {
          local_4 = EQUAL;
          goto LAB_00896131;
        }
        bVar1 = SubtermIterator::hasNext
                          ((SubtermIterator *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        local_78 = CONCAT71(extraout_var,bVar1);
        if (!bVar1) {
          SubtermIterator::~SubtermIterator
                    ((SubtermIterator *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          _Unwind_Resume(local_78);
        }
        local_88[0] = SubtermIterator::next
                                ((SubtermIterator *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_90 = SubtermIterator::next
                             ((SubtermIterator *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        bVar1 = TermList::isTerm((TermList *)0x895fc4);
        if (bVar1) break;
        bVar1 = TermList::isTerm((TermList *)0x896083);
        in_stack_ffffffffffffff2c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
        if (bVar1) {
          local_4 = LESS;
          goto LAB_00896131;
        }
        in_stack_ffffffffffffff28 = TermList::var(local_88);
        in_stack_ffffffffffffff24 = TermList::var(&local_90);
        if (in_stack_ffffffffffffff28 != in_stack_ffffffffffffff24) {
          in_stack_ffffffffffffff20 = TermList::var(local_88);
          uVar2 = TermList::var(&local_90);
          local_4 = Lib::Int::compare(in_stack_ffffffffffffff20,uVar2);
          goto LAB_00896131;
        }
      }
      bVar1 = TermList::isTerm((TermList *)0x895fe1);
      if (!bVar1) {
        local_4 = GREATER;
        goto LAB_00896131;
      }
      pTVar4 = TermList::term((TermList *)0x895ffb);
      uVar2 = Term::functor(pTVar4);
      pTVar4 = TermList::term((TermList *)0x89601a);
      uVar3 = Term::functor(pTVar4);
    } while (uVar2 == uVar3);
    local_4 = Lib::Int::compare(uVar2,uVar3);
LAB_00896131:
    SubtermIterator::~SubtermIterator
              ((SubtermIterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    SubtermIterator::~SubtermIterator
              ((SubtermIterator *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  else {
    uVar2 = Literal::header((Literal *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                           );
    uVar3 = Literal::header((Literal *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                           );
    local_4 = Lib::Int::compare(uVar2,uVar3);
  }
  return local_4;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    ASS(l1->shared());
    ASS(l2->shared());

    if(l1->header()!=l2->header()) {
      return Int::compare(l1->header(),l2->header());
    }

    SubtermIterator sit1(l1);
    SubtermIterator sit2(l2);
    while(sit1.hasNext()) {
      ALWAYS(sit2.hasNext());
      TermList st1=sit1.next();
      TermList st2=sit2.next();
      if(st1.isTerm()) {
	if(st2.isTerm()) {
	  unsigned f1=st1.term()->functor();
	  unsigned f2=st2.term()->functor();
	  if(f1!=f2) {
	    return Int::compare(f1,f2);
	  }
	} else {
	  return GREATER;
	}
      } else {
	if(st2.isTerm()) {
	  return LESS;
	} else {
	  if(st1.var()!=st2.var()) {
	    return Int::compare(st1.var(),st2.var());
	  }
	}
      }
    }
    ASS(l1==l2);
    return EQUAL;
  }